

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O1

void __thiscall rtosc::ThreadLink::~ThreadLink(ThreadLink *this)

{
  char *pcVar1;
  
  pcVar1 = this->ring->buffer;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  if (this->ring != (internal_ringbuffer_t *)0x0) {
    operator_delete(this->ring,0x28);
  }
  if (this->write_buffer != (char *)0x0) {
    operator_delete__(this->write_buffer);
  }
  if (this->read_buffer != (char *)0x0) {
    operator_delete__(this->read_buffer);
    return;
  }
  return;
}

Assistant:

ThreadLink::~ThreadLink(void)
{
    delete[] ring->buffer;
    delete   ring;
    delete[] write_buffer;
    delete[] read_buffer;
}